

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liana.c
# Opt level: O1

int mk_liana_close(mk_plugin *plugin,int socket_fd)

{
  int iVar1;
  
  iVar1 = close(socket_fd);
  return iVar1;
}

Assistant:

int mk_liana_close(struct mk_plugin *plugin, int socket_fd)
{
    (void) plugin;

#ifdef _WIN32
    return closesocket(socket_fd);
#else
    return close(socket_fd);
#endif
}